

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Overlay_Window.cxx
# Opt level: O0

void __thiscall Fl_Overlay_Window::flush(Fl_Overlay_Window *this)

{
  Fl_Overlay_Window *pFVar1;
  byte bVar2;
  byte bVar3;
  int erase_overlay;
  Fl_Overlay_Window *this_local;
  
  bVar2 = Fl_Widget::damage((Fl_Widget *)this);
  pFVar1 = (Fl_Overlay_Window *)this->overlay_;
  bVar3 = Fl_Widget::damage((Fl_Widget *)this);
  Fl_Widget::clear_damage((Fl_Widget *)this,bVar3 & 0xf7);
  Fl_Double_Window::flush(&this->super_Fl_Double_Window,bVar2 & 8 | (uint)(pFVar1 == this));
  if ((Fl_Overlay_Window *)this->overlay_ == this) {
    (*(this->super_Fl_Double_Window).super_Fl_Window.super_Fl_Group.super_Fl_Widget._vptr_Fl_Widget
      [0xb])();
  }
  return;
}

Assistant:

void Fl_Overlay_Window::flush() {
#ifdef BOXX_BUGS
  if (overlay_ && overlay_ != this && overlay_->shown()) {
    // all drawing to windows hidden by overlay windows is ignored, fix this
    XUnmapWindow(fl_display, fl_xid(overlay_));
    Fl_Double_Window::flush(0);
    XMapWindow(fl_display, fl_xid(overlay_));
    return;
  }
#endif
  int erase_overlay = (damage()&FL_DAMAGE_OVERLAY) | (overlay_ == this);
  clear_damage((uchar)(damage()&~FL_DAMAGE_OVERLAY));
  Fl_Double_Window::flush(erase_overlay);
  if (overlay_ == this) draw_overlay();
}